

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeNVT::FluctuatingChargeNVT(FluctuatingChargeNVT *this,SimInfo *info)

{
  SnapshotManager *this_00;
  Snapshot *pSVar1;
  SimInfo *in_RSI;
  SimInfo *in_RDI;
  FluctuatingChargePropagator *in_stack_ffffffffffffffd0;
  int *piVar2;
  
  FluctuatingChargePropagator::FluctuatingChargePropagator(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI->_vptr_SimInfo = (_func_int **)&PTR__FluctuatingChargeNVT_00501f68;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x397a7f);
  in_RDI->nConstraints_ = 4;
  in_RDI->nGlobalRigidBodies_ = -0x5f4a1273;
  in_RDI->nGlobalFluctuatingCharges_ = 0x3eb0c6f7;
  piVar2 = &in_RDI->nGlobalConstraints_;
  this_00 = SimInfo::getSnapshotManager(in_RSI);
  pSVar1 = SnapshotManager::getCurrentSnapshot(this_00);
  *(Snapshot **)piVar2 = pSVar1;
  Thermo::Thermo((Thermo *)&in_RDI->ndf_,in_RSI);
  return;
}

Assistant:

FluctuatingChargeNVT::FluctuatingChargeNVT(SimInfo* info) :
      FluctuatingChargePropagator(info), maxIterNum_(4), chiTolerance_(1e-6),
      snap(info->getSnapshotManager()->getCurrentSnapshot()), thermo(info) {}